

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O2

void __thiscall
adios2::transport::FilePOSIX::Open
          (FilePOSIX *this,string *name,Mode openMode,bool async,bool directio)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Result<int> *p_Var3;
  int *piVar4;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *process;
  __allocator_type __a2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  __state_type local_178;
  __allocator_type __a2_1;
  thread local_150;
  undefined8 local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_140 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __rhs = &(this->super_Transport).m_Name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  (*(this->super_Transport)._vptr_Transport[0x13])(this);
  this->m_DirectIO = directio;
  (this->super_Transport).m_OpenMode = openMode;
  if (openMode == Append) {
    std::__cxx11::string::string((string *)&local_90,"open",(allocator *)&local_198);
    Transport::ProfilerStart(&this->super_Transport,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    piVar4 = __errno_location();
    *piVar4 = 0;
    iVar1 = open((this->super_Transport).m_Name._M_dataplus._M_p,(uint)directio << 0xe | 0x42,0x1ff)
    ;
    this->m_FileDescriptor = iVar1;
    lseek(iVar1,0,2);
    this->m_Errno = *piVar4;
    process = &local_b0;
LAB_00604820:
    std::__cxx11::string::string((string *)process,"open",(allocator *)&local_198);
    Transport::ProfilerStop(&this->super_Transport,process);
  }
  else {
    if (openMode == Read) {
      std::__cxx11::string::string((string *)&local_d0,"open",(allocator *)&local_198);
      Transport::ProfilerStart(&this->super_Transport,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      piVar4 = __errno_location();
      *piVar4 = 0;
      iVar1 = open((this->super_Transport).m_Name._M_dataplus._M_p,0);
      this->m_FileDescriptor = iVar1;
      this->m_Errno = *piVar4;
      process = &local_f0;
      goto LAB_00604820;
    }
    if (openMode == Write) {
      if (async) {
        this->m_IsOpening = true;
        local_178.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_178.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
        p_Var2->_M_use_count = 1;
        p_Var2->_M_weak_count = 1;
        p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00823ed8;
        p_Var2[1]._M_use_count = 0;
        p_Var2[1]._M_weak_count = 0;
        *(undefined4 *)&p_Var2[2]._vptr__Sp_counted_base = 0;
        *(undefined1 *)((long)&p_Var2[2]._vptr__Sp_counted_base + 4) = 0;
        p_Var2[2]._M_use_count = 0;
        local_198._M_dataplus._M_p = (pointer)&__a2;
        p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var2[3]._M_use_count = 0;
        p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00823f28;
        local_198._M_string_length = (size_type)p_Var2;
        p_Var3 = (_Result<int> *)operator_new(0x18);
        std::__future_base::_Result<int>::_Result(p_Var3);
        p_Var2[4]._vptr__Sp_counted_base = (_func_int **)p_Var3;
        *(bool *)&p_Var2[4]._M_use_count = directio;
        std::__cxx11::string::string((string *)(p_Var2 + 5),(string *)name);
        p_Var2[7]._vptr__Sp_counted_base = (_func_int **)this;
        local_150._M_id._M_thread = (id)0;
        ___a2_1 = (long *)operator_new(0x20);
        *___a2_1 = (long)&PTR___State_00823f80;
        ___a2_1[1] = (long)(p_Var2 + 1);
        ___a2_1[2] = (long)std::__future_base::
                           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FilePOSIX.cpp:88:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_int>
                           ::_M_run;
        ___a2_1[3] = 0;
        std::thread::_M_start_thread(&local_150,&__a2_1,0);
        if (___a2_1 != (long *)0x0) {
          (**(code **)(*___a2_1 + 8))();
        }
        std::thread::operator=((thread *)(p_Var2 + 3),&local_150);
        std::thread::~thread(&local_150);
        local_198._M_string_length = 0;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FilePOSIX.cpp:88:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FilePOSIX.cpp:88:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FilePOSIX_cpp:88:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FilePOSIX_cpp:88:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                            *)&local_198);
        local_148 = 0;
        a_Stack_140[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_198._M_dataplus._M_p =
             (pointer)local_178.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
        local_198._M_string_length =
             (size_type)
             local_178.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_178.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)(p_Var2 + 1);
        local_178.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var2;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_140);
        if (local_178.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            == (element_type *)0x0) {
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
          p_Var2->_M_use_count = 1;
          p_Var2->_M_weak_count = 1;
          p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00823fc0;
          p_Var2[1]._M_use_count = 0;
          p_Var2[1]._M_weak_count = 0;
          local_198._M_dataplus._M_p = (pointer)&__a2_1;
          *(undefined4 *)&p_Var2[2]._vptr__Sp_counted_base = 0;
          *(undefined1 *)((long)&p_Var2[2]._vptr__Sp_counted_base + 4) = 0;
          p_Var2[2]._M_use_count = 0;
          p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_00824010;
          local_198._M_string_length = (size_type)p_Var2;
          p_Var3 = (_Result<int> *)operator_new(0x18);
          std::__future_base::_Result<int>::_Result(p_Var3);
          p_Var2[3]._vptr__Sp_counted_base = (_func_int **)p_Var3;
          *(bool *)&p_Var2[3]._M_use_count = directio;
          std::__cxx11::string::string((string *)(p_Var2 + 4),(string *)name);
          p_Var2[6]._vptr__Sp_counted_base = (_func_int **)this;
          local_198._M_string_length = 0;
          std::
          __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FilePOSIX.cpp:88:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_int>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FilePOSIX.cpp:88:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
          ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FilePOSIX_cpp:88:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_int>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_transport_file_FilePOSIX_cpp:88:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                              *)&local_198);
          local_148 = 0;
          a_Stack_140[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_198._M_dataplus._M_p =
               (pointer)local_178.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
          local_198._M_string_length =
               (size_type)
               local_178.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          local_178.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)(p_Var2 + 1);
          local_178.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var2;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198._M_string_length);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_140);
        }
        std::__basic_future<int>::__basic_future((__basic_future<int> *)&local_198,&local_178);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_178.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::future<int>::operator=(&this->m_OpenFuture,(future<int> *)&local_198);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198._M_string_length);
        goto LAB_00604843;
      }
      std::__cxx11::string::string((string *)&local_50,"open",(allocator *)&local_198);
      Transport::ProfilerStart(&this->super_Transport,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      piVar4 = __errno_location();
      *piVar4 = 0;
      iVar1 = open((this->super_Transport).m_Name._M_dataplus._M_p,(uint)directio << 0xe | 0x241,
                   0x1b6);
      this->m_FileDescriptor = iVar1;
      this->m_Errno = *piVar4;
      process = &local_70;
      goto LAB_00604820;
    }
    std::operator+(&local_198,"unknown open mode for file ",__rhs);
    std::operator+(&local_110,&local_198,", in call to POSIX open");
    CheckFile(this,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    process = &local_198;
  }
  std::__cxx11::string::~string((string *)process);
LAB_00604843:
  if (this->m_IsOpening == false) {
    std::operator+(&local_198,"couldn\'t open file ",__rhs);
    std::operator+(&local_130,&local_198,", in call to POSIX open");
    CheckFile(this,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_198);
    (this->super_Transport).m_IsOpen = true;
  }
  return;
}

Assistant:

void FilePOSIX::Open(const std::string &name, const Mode openMode, const bool async,
                     const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name, const bool directio) -> int {
        ProfilerStart("open");
        errno = 0;
        int flag = __GetOpenFlag(O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, directio);
        int FD = open(m_Name.c_str(), flag, 0666);
        m_Errno = errno;
        ProfilerStop("open");
        return FD;
    };

    m_Name = name;
    CheckName();
    m_DirectIO = directio;
    m_OpenMode = openMode;
    switch (m_OpenMode)
    {

    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name, directio);
        }
        else
        {
            ProfilerStart("open");
            errno = 0;
            m_FileDescriptor =
                open(m_Name.c_str(),
                     __GetOpenFlag(O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, directio), 0666);
            m_Errno = errno;
            ProfilerStop("open");
        }
        break;

    case Mode::Append:
        ProfilerStart("open");
        errno = 0;
        m_FileDescriptor =
            open(m_Name.c_str(), __GetOpenFlag(O_RDWR | O_CREAT | O_BINARY, directio), 0777);
        lseek(m_FileDescriptor, 0, SEEK_END);
        m_Errno = errno;
        ProfilerStop("open");
        break;

    case Mode::Read:
        ProfilerStart("open");
        errno = 0;
        m_FileDescriptor = open(m_Name.c_str(), O_RDONLY | O_BINARY);
        m_Errno = errno;
        ProfilerStop("open");
        break;

    default:
        CheckFile("unknown open mode for file " + m_Name + ", in call to POSIX open");
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name + ", in call to POSIX open");
        m_IsOpen = true;
    }
}